

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.hpp
# Opt level: O0

double __thiscall minimax::Eval<uttt::IBoard>::operator()(Eval<uttt::IBoard> *this,IBoard *game)

{
  IPlayer IVar1;
  int iVar2;
  IBoard *in_RSI;
  int status;
  undefined8 local_8;
  
  iVar2 = uttt::IBoard::GetStatus(in_RSI);
  if ((iVar2 == 0) || (iVar2 == -1)) {
    local_8 = 0.0;
  }
  else {
    IVar1 = uttt::IBoard::GetPlayerToMove(in_RSI);
    if (IVar1 == iVar2) {
      local_8 = std::numeric_limits<double>::max();
    }
    else {
      local_8 = std::numeric_limits<double>::max();
      local_8 = -local_8;
    }
  }
  return local_8;
}

Assistant:

double
Eval<IGame>::operator()(const IGame &game) const
{
    int status = game.GetStatus();
    if (status == game::Draw || status == game::Undecided)
        return 0.0;
    if (game.GetPlayerToMove() == status)
        return std::numeric_limits<double>::max();
    return -std::numeric_limits<double>::max();
}